

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

void __thiscall
acto::actor::handler<msg_finish,Wall,msg_finish_const&>(actor *this,offset_in_Wall_to_subr func)

{
  unique_ptr<acto::actor::mem_handler_t<msg_finish,_Wall,_const_msg_finish_&>,_std::default_delete<acto::actor::mem_handler_t<msg_finish,_Wall,_const_msg_finish_&>_>_>
  local_48;
  unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_> local_40;
  type_index local_38;
  Wall *local_30;
  offset_in_Wall_to_subr func_local;
  actor *local_20;
  actor *this_local;
  
  local_30 = (Wall *)func;
  local_20 = this;
  this_local = (actor *)func;
  std::type_index::type_index(&local_38,(type_info *)&msg_finish::typeinfo);
  std::
  make_unique<acto::actor::mem_handler_t<msg_finish,Wall,msg_finish_const&>,void(Wall::*&)(acto::actor_ref,msg_finish_const&),Wall*>
            ((offset_in_Wall_to_subr *)&local_48,&local_30);
  std::unique_ptr<acto::actor::handler_t,std::default_delete<acto::actor::handler_t>>::
  unique_ptr<acto::actor::mem_handler_t<msg_finish,Wall,msg_finish_const&>,std::default_delete<acto::actor::mem_handler_t<msg_finish,Wall,msg_finish_const&>>,void>
            ((unique_ptr<acto::actor::handler_t,std::default_delete<acto::actor::handler_t>> *)
             &local_40,&local_48);
  set_handler(this,&local_38,&local_40);
  std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>::~unique_ptr
            (&local_40);
  std::
  unique_ptr<acto::actor::mem_handler_t<msg_finish,_Wall,_const_msg_finish_&>,_std::default_delete<acto::actor::mem_handler_t<msg_finish,_Wall,_const_msg_finish_&>_>_>
  ::~unique_ptr(&local_48);
  return;
}

Assistant:

void handler(void (ClassName::*func)(actor_ref, P)) {
    set_handler(
      // Type of the handler.
      std::type_index(typeid(M)),
      // Callback.
      std::make_unique<mem_handler_t<M, ClassName, P>>(
        func, static_cast<ClassName*>(this)));
  }